

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_ll_uploadtoblob.c
# Opt level: O2

IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE
IoTHubClient_LL_UploadToBlob_CreateContext
          (IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE handle,char *azureBlobSasUri)

{
  ulong uVar1;
  LOGGER_LOG p_Var2;
  IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT *uploadContext;
  SINGLYLINKEDLIST_HANDLE pSVar3;
  size_t sVar4;
  char *__src;
  char *blobStorageHostname;
  ulong uVar5;
  HTTPAPIEX_HANDLE pHVar6;
  int iVar7;
  size_t __size;
  char *pcVar8;
  size_t sVar9;
  
  if (handle == (IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE)0x0 || azureBlobSasUri == (char *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return (IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE)0x0;
    }
    pcVar8 = "invalid argument detected handle=%p azureBlobSasUri=%p";
    iVar7 = 0x3a5;
    goto LAB_00125ac9;
  }
  uploadContext = (IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT *)calloc(1,0x28);
  if (uploadContext == (IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                ,"createUploadToBlobContextInstance",0x2c3,1,
                "Failed allocating IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT");
    }
  }
  else {
    pSVar3 = singlylinkedlist_create();
    uploadContext->blockIdList = pSVar3;
    if (pSVar3 != (SINGLYLINKEDLIST_HANDLE)0x0) {
      sVar4 = strlen(azureBlobSasUri);
      pcVar8 = strstr(azureBlobSasUri,"://");
      if (pcVar8 == (char *)0x0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          pcVar8 = "hostname cannot be determined";
          iVar7 = 0x2f3;
LAB_00125b66:
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                    ,"parseAzureBlobSasUri",iVar7,1,pcVar8);
        }
LAB_00125b6b:
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_00125b9d;
        pcVar8 = "failed parsing Blob Storage SAS URI";
        iVar7 = 0x3b2;
      }
      else {
        pcVar8 = pcVar8 + 3;
        __src = strchr(pcVar8,0x2f);
        if (__src == (char *)0x0) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            pcVar8 = "relative path cannot be determined";
            iVar7 = 0x2fd;
            goto LAB_00125b66;
          }
          goto LAB_00125b6b;
        }
        sVar9 = (long)__src - (long)pcVar8;
        if (__src < pcVar8) {
          sVar9 = 0xffffffffffffffff;
        }
        __size = sVar9 + 1;
        if (sVar9 + 1 == 0) {
          __size = 0xffffffffffffffff;
        }
        if ((__size == 0xffffffffffffffff) ||
           (blobStorageHostname = (char *)malloc(__size), blobStorageHostname == (char *)0x0)) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            pcVar8 = "failed to allocate memory for blob storage hostname, size:%zu";
            iVar7 = 0x307;
            goto LAB_00125b66;
          }
          goto LAB_00125b6b;
        }
        memcpy(blobStorageHostname,pcVar8,sVar9);
        blobStorageHostname[sVar9] = '\0';
        uVar1 = 0xffffffffffffffff;
        uVar5 = (long)__src - (long)azureBlobSasUri;
        if (__src < azureBlobSasUri) {
          uVar5 = uVar1;
        }
        sVar9 = sVar4 - uVar5;
        if (sVar4 < uVar5) {
          sVar9 = uVar1;
        }
        sVar4 = sVar9 + 1;
        if (sVar9 + 1 == 0) {
          sVar4 = uVar1;
        }
        if ((sVar4 == 0xffffffffffffffff) || (pcVar8 = (char *)malloc(sVar4), pcVar8 == (char *)0x0)
           ) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                      ,"parseAzureBlobSasUri",0x314,1,
                      "failed to allocate memory for blob storage relative path, size:%zu",sVar4);
          }
          free(blobStorageHostname);
          goto LAB_00125b6b;
        }
        memcpy(pcVar8,__src,sVar9);
        pcVar8[sVar9] = '\0';
        uploadContext->blobStorageHostname = blobStorageHostname;
        uploadContext->blobStorageRelativePath = pcVar8;
        uploadContext->u2bClientData = handle;
        pHVar6 = Blob_CreateHttpConnection
                           (blobStorageHostname,handle->certificates,&handle->http_proxy_options,
                            handle->networkInterface,handle->blob_upload_timeout_millisecs);
        uploadContext->blobHttpApiHandle = pHVar6;
        if (pHVar6 != (HTTPAPIEX_HANDLE)0x0) {
          return uploadContext;
        }
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_00125b9d;
        pcVar8 = "Failed creating HTTP connection to Azure Blob";
        iVar7 = 0x3c3;
      }
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                ,"IoTHubClient_LL_UploadToBlob_CreateContext",iVar7,1,pcVar8);
LAB_00125b9d:
      destroyUploadToBlobContextInstance(uploadContext);
      return (IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE)0x0;
    }
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                ,"createUploadToBlobContextInstance",0x2cb,1,"Failed allocating list for blockIds");
    }
    free(uploadContext);
  }
  p_Var2 = xlogging_get_log_function();
  if (p_Var2 == (LOGGER_LOG)0x0) {
    return (IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE)0x0;
  }
  pcVar8 = "Failed creating Upload to Blob context";
  iVar7 = 0x3aa;
LAB_00125ac9:
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
            ,"IoTHubClient_LL_UploadToBlob_CreateContext",iVar7,1,pcVar8);
  return (IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE)0x0;
}

Assistant:

IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE IoTHubClient_LL_UploadToBlob_CreateContext(IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE handle, const char* azureBlobSasUri)
{
    IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT* result;

    if (handle == NULL || azureBlobSasUri == NULL)
    {
        LogError("invalid argument detected handle=%p azureBlobSasUri=%p", handle, azureBlobSasUri);
        result = NULL;
    }
    else if ((result = createUploadToBlobContextInstance()) == NULL)
    {
        LogError("Failed creating Upload to Blob context");
    }
    else
    {
        IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE_DATA* upload_data = (IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE_DATA*)handle;

        if (parseAzureBlobSasUri(azureBlobSasUri, &result->blobStorageHostname, &result->blobStorageRelativePath) != 0)
        {
            LogError("failed parsing Blob Storage SAS URI");
            destroyUploadToBlobContextInstance(result);
            result = NULL;
        }
        else
        {
            result->u2bClientData = upload_data;

            result->blobHttpApiHandle = Blob_CreateHttpConnection(
                result->blobStorageHostname,
                result->u2bClientData->certificates,
                &(result->u2bClientData->http_proxy_options),
                result->u2bClientData->networkInterface,
                result->u2bClientData->blob_upload_timeout_millisecs);

            if (result->blobHttpApiHandle == NULL)
            {
                LogError("Failed creating HTTP connection to Azure Blob");
                destroyUploadToBlobContextInstance(result);
                result = NULL;
            }
        }
    }

    return result;
}